

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CfgNode.cpp
# Opt level: O1

void __thiscall CfgNode::BlockData::~BlockData(BlockData *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Self __tmp_1;
  _Self __tmp;
  
  (this->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_0012a7e8;
  for (p_Var3 = (this->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_calls)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var3[1]._M_parent + 8))();
    }
  }
  for (p_Var3 = (this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[1]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var3[1]._M_parent + 8))();
    }
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_CfgSignalHandler_*>,_std::_Select1st<std::pair<const_int,_CfgSignalHandler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_CfgSignalHandler_*>_>_>
  ::~_Rb_tree(&(this->m_signalHandlers)._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_CfgCall_*>,_std::_Select1st<std::pair<const_unsigned_long,_CfgCall_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgCall_*>_>_>
  ::~_Rb_tree(&(this->m_calls)._M_t);
  p_Var2 = (this->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var2 != (_List_node_base *)&this->m_instrs) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  return;
}

Assistant:

CfgNode::BlockData::~BlockData() {
	for (std::map<Addr, CfgCall*>::iterator it = m_calls.begin(),
			ed = m_calls.end(); it != ed; it++) {
		delete it->second;
	}

	for (std::map<int, CfgSignalHandler*>::iterator it = m_signalHandlers.begin(),
			ed = m_signalHandlers.end(); it != ed; it++) {
		delete it->second;
	}
}